

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_tar_ustar.c
# Opt level: O0

void test_write_format_tar_ustar(void)

{
  char f256 [257];
  char f100 [101];
  char f99 [100];
  int i;
  size_t used;
  size_t buffsize;
  char *e;
  char *buff;
  archive_entry *entry;
  archive *a;
  void *in_stack_fffffffffffffdc8;
  archive_entry *paVar1;
  void *pvVar2;
  archive_entry *in_stack_fffffffffffffdd0;
  char *pcVar3;
  archive *in_stack_fffffffffffffdd8;
  undefined8 uVar4;
  longlong v1;
  undefined4 in_stack_fffffffffffffde0;
  wchar_t in_stack_fffffffffffffde4;
  archive *in_stack_fffffffffffffde8;
  void *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe10;
  void *in_stack_fffffffffffffe18;
  char *in_stack_fffffffffffffe20;
  void *in_stack_fffffffffffffe28;
  wchar_t in_stack_fffffffffffffe34;
  char *in_stack_fffffffffffffe38;
  size_t in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  void *in_stack_fffffffffffffe60;
  char local_108 [100];
  undefined1 local_a4;
  char local_98 [99];
  undefined1 local_35;
  int local_34;
  undefined8 local_28;
  char *local_20;
  char *local_18;
  archive_entry *local_10;
  archive_entry *local_8;
  
  local_28 = 100000;
  for (local_34 = 0; local_34 < 99; local_34 = local_34 + 1) {
    local_98[local_34] = (char)(local_34 % 0x1a) + 'a';
  }
  local_35 = 0;
  for (local_34 = 0; local_34 < 100; local_34 = local_34 + 1) {
    local_108[local_34] = (char)(local_34 % 0x1a) + 'A';
  }
  local_a4 = 0;
  for (local_34 = 0; local_34 < 0x100; local_34 = local_34 + 1) {
    (&stack0xfffffffffffffde8)[local_34] = (char)(local_34 % 0x1a) + 'A';
  }
  local_18 = (char *)malloc(100000);
  local_8 = (archive_entry *)archive_write_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   (wchar_t)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                   (wchar_t)in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,
                   in_stack_fffffffffffffdc8);
  archive_write_set_format_ustar(in_stack_fffffffffffffdd8);
  assertion_equal_int((char *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                      (longlong)in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,
                      (longlong)local_8,(char *)0x20b6de,in_stack_fffffffffffffe00);
  archive_write_add_filter_none((archive *)local_8);
  assertion_equal_int((char *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                      (longlong)in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,
                      (longlong)local_8,(char *)0x20b71d,in_stack_fffffffffffffe00);
  archive_write_open_memory
            (in_stack_fffffffffffffde8,
             (void *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
             (size_t)in_stack_fffffffffffffdd8,(size_t *)in_stack_fffffffffffffdd0);
  paVar1 = local_8;
  assertion_equal_int((char *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                      (longlong)in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,
                      (longlong)local_8,(char *)0x20b774,in_stack_fffffffffffffe00);
  local_10 = archive_entry_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   (wchar_t)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                   (wchar_t)in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,paVar1);
  archive_entry_set_mtime(local_10,1,10);
  archive_entry_set_pathname(in_stack_fffffffffffffdd0,(char *)paVar1);
  archive_entry_set_mode(local_10,0x81b4);
  archive_entry_set_size(local_10,10);
  archive_entry_set_uid(local_10,0x50);
  archive_entry_set_gid(local_10,0x5a);
  archive_entry_set_dev(local_10,0xc);
  archive_entry_set_ino(local_10,0x59);
  archive_entry_set_nlink(local_10,2);
  archive_write_header((archive *)in_stack_fffffffffffffdd0,paVar1);
  paVar1 = local_8;
  assertion_equal_int((char *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                      (longlong)in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,
                      (longlong)local_8,(char *)0x20b89a,in_stack_fffffffffffffe00);
  archive_entry_free((archive_entry *)0x20b8a7);
  archive_write_data((archive *)in_stack_fffffffffffffdd0,paVar1,0x20b8c0);
  paVar1 = local_8;
  assertion_equal_int((char *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                      (longlong)in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,
                      (longlong)local_8,(char *)0x20b8f3,in_stack_fffffffffffffe00);
  local_10 = archive_entry_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   (wchar_t)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                   (wchar_t)in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,paVar1);
  archive_entry_set_mtime(local_10,1,10);
  archive_entry_set_pathname(in_stack_fffffffffffffdd0,(char *)paVar1);
  archive_entry_set_mode(local_10,0x81b4);
  archive_entry_set_uid(local_10,0x50);
  archive_entry_set_gid(local_10,0x5a);
  archive_entry_set_dev(local_10,0xc);
  archive_entry_set_ino(local_10,0x59);
  archive_entry_set_nlink(local_10,2);
  archive_write_header((archive *)in_stack_fffffffffffffdd0,paVar1);
  paVar1 = local_8;
  assertion_equal_int((char *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                      (longlong)in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,
                      (longlong)local_8,(char *)0x20ba07,in_stack_fffffffffffffe00);
  archive_entry_free((archive_entry *)0x20ba14);
  archive_write_data((archive *)in_stack_fffffffffffffdd0,paVar1,0x20ba2d);
  paVar1 = local_8;
  assertion_equal_int((char *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                      (longlong)in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,
                      (longlong)local_8,(char *)0x20ba5f,in_stack_fffffffffffffe00);
  local_10 = archive_entry_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   (wchar_t)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                   (wchar_t)in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,paVar1);
  archive_entry_set_mtime(local_10,2,0x14);
  archive_entry_set_pathname(in_stack_fffffffffffffdd0,(char *)paVar1);
  archive_entry_set_mode(local_10,0x41fd);
  archive_entry_set_size(local_10,10);
  archive_entry_set_nlink(local_10,2);
  archive_write_header((archive *)in_stack_fffffffffffffdd0,paVar1);
  paVar1 = local_8;
  assertion_equal_int((char *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                      (longlong)in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,
                      (longlong)local_8,(char *)0x20bb3d,in_stack_fffffffffffffe00);
  archive_entry_free((archive_entry *)0x20bb4a);
  archive_write_data((archive *)in_stack_fffffffffffffdd0,paVar1,0x20bb63);
  paVar1 = local_8;
  assertion_equal_int((char *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                      (longlong)in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,
                      (longlong)local_8,(char *)0x20bb95,in_stack_fffffffffffffe00);
  local_10 = archive_entry_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   (wchar_t)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                   (wchar_t)in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,paVar1);
  archive_entry_set_mtime(local_10,3,0x1e);
  archive_entry_set_pathname(in_stack_fffffffffffffdd0,(char *)paVar1);
  archive_entry_set_mode(local_10,0x1b4);
  archive_entry_set_filetype(local_10,0xa000);
  archive_entry_set_symlink(in_stack_fffffffffffffdd0,(char *)paVar1);
  archive_entry_set_size(local_10,0);
  archive_entry_set_uid(local_10,0x58);
  archive_entry_set_gid(local_10,0x62);
  archive_entry_set_dev(local_10,0xc);
  archive_entry_set_ino(local_10,0x5a);
  archive_entry_set_nlink(local_10,1);
  archive_write_header((archive *)in_stack_fffffffffffffdd0,paVar1);
  paVar1 = local_8;
  assertion_equal_int((char *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                      (longlong)in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,
                      (longlong)local_8,(char *)0x20bce0,in_stack_fffffffffffffe00);
  archive_entry_free((archive_entry *)0x20bced);
  archive_write_data((archive *)in_stack_fffffffffffffdd0,paVar1,0x20bd06);
  paVar1 = local_8;
  assertion_equal_int((char *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                      (longlong)in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,
                      (longlong)local_8,(char *)0x20bd38,in_stack_fffffffffffffe00);
  local_10 = archive_entry_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   (wchar_t)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                   (wchar_t)in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,paVar1);
  archive_entry_set_mtime(local_10,1,10);
  archive_entry_set_pathname(in_stack_fffffffffffffdd0,(char *)paVar1);
  archive_entry_set_mode(local_10,0x81b4);
  archive_entry_set_size(local_10,0);
  archive_entry_set_uid(local_10,0x52);
  archive_entry_set_gid(local_10,0x5d);
  archive_entry_set_dev(local_10,0x66);
  archive_entry_set_ino(local_10,7);
  archive_entry_set_nlink(local_10,1);
  archive_write_header((archive *)in_stack_fffffffffffffdd0,paVar1);
  paVar1 = local_8;
  assertion_equal_int((char *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                      (longlong)in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,
                      (longlong)local_8,(char *)0x20be5e,in_stack_fffffffffffffe00);
  archive_entry_free((archive_entry *)0x20be6b);
  local_10 = archive_entry_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   (wchar_t)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                   (wchar_t)in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,paVar1);
  archive_entry_set_mtime(local_10,1,10);
  archive_entry_set_pathname(in_stack_fffffffffffffdd0,(char *)paVar1);
  archive_entry_set_mode(local_10,0x81b4);
  archive_entry_set_size(local_10,0);
  archive_entry_set_uid(local_10,0x52);
  archive_entry_set_gid(local_10,0x5d);
  archive_entry_set_dev(local_10,0x66);
  archive_entry_set_ino(local_10,7);
  archive_entry_set_nlink(local_10,1);
  archive_write_header((archive *)in_stack_fffffffffffffdd0,paVar1);
  paVar1 = local_8;
  assertion_equal_int((char *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                      (longlong)in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,
                      (longlong)local_8,(char *)0x20bf91,in_stack_fffffffffffffe00);
  archive_entry_free((archive_entry *)0x20bf9e);
  local_10 = archive_entry_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   (wchar_t)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                   (wchar_t)in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,paVar1);
  archive_entry_set_mtime(local_10,1,10);
  archive_entry_set_pathname(in_stack_fffffffffffffdd0,(char *)paVar1);
  archive_entry_set_mode(local_10,0x81b4);
  archive_entry_set_size(local_10,0);
  archive_entry_set_uid(local_10,0x52);
  archive_entry_set_gid(local_10,0x5d);
  archive_entry_set_dev(local_10,0x66);
  archive_entry_set_ino(local_10,7);
  archive_entry_set_nlink(local_10,1);
  archive_write_header((archive *)in_stack_fffffffffffffdd0,paVar1);
  assertion_equal_int((char *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                      (longlong)in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,
                      (longlong)local_8,(char *)0x20c0c1,in_stack_fffffffffffffe00);
  archive_entry_free((archive_entry *)0x20c0ce);
  archive_write_free((archive *)0x20c0db);
  assertion_equal_int((char *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                      (longlong)in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,0,
                      (char *)0x20c109,in_stack_fffffffffffffe00);
  local_20 = local_18;
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20,0,5);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 100,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x6c,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x74,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x7c,0,0xc);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x88,0,0xc);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x94,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x9c,0,1);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x9d,0,1);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x101,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x109,0,1);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x129,0,1);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x149,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x151,0,8);
  pvVar2 = (void *)0x1;
  pcVar3 = "1";
  uVar4 = 0;
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x159,0,1);
  is_null(local_20,0x200);
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   (wchar_t)((ulong)uVar4 >> 0x20),(wchar_t)uVar4,pcVar3,pvVar2);
  pvVar2 = (void *)0xa;
  pcVar3 = "10";
  uVar4 = 0;
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x200,0,10);
  is_null(local_20 + 0x200,0x200);
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   (wchar_t)((ulong)uVar4 >> 0x20),(wchar_t)uVar4,pcVar3,pvVar2);
  local_20 = local_20 + 0x400;
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20,0,9);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 100,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x6c,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x74,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x7c,0,0xc);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x88,0,0xc);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x94,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x9c,0,1);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x9d,0,1);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x101,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x109,0,1);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x129,0,1);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x149,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x151,0,8);
  pvVar2 = (void *)0x1;
  pcVar3 = "1";
  uVar4 = 0;
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x159,0,1);
  is_null(local_20,0x200);
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   (wchar_t)((ulong)uVar4 >> 0x20),(wchar_t)uVar4,pcVar3,pvVar2);
  local_20 = local_20 + 0x200;
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20,0,4);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 100,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x6c,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x74,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x7c,0,0xc);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x88,0,0xc);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x94,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x9c,0,1);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x9d,0,1);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x101,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x109,0,1);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x129,0,1);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x149,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x151,0,8);
  pvVar2 = (void *)0x1;
  pcVar3 = "1";
  uVar4 = 0;
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x159,0,1);
  is_null(local_20,0x200);
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   (wchar_t)((ulong)uVar4 >> 0x20),(wchar_t)uVar4,pcVar3,pvVar2);
  local_20 = local_20 + 0x200;
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 100,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x6c,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x74,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x7c,0,0xc);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x88,0,0xc);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x94,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x9c,0,1);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x9d,0,5);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x101,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x109,0,1);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x129,0,1);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x149,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x151,0,8);
  pvVar2 = (void *)0x1;
  pcVar3 = "1";
  uVar4 = 0;
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x159,0,1);
  is_null(local_20,0x200);
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   (wchar_t)((ulong)uVar4 >> 0x20),(wchar_t)uVar4,pcVar3,pvVar2);
  local_20 = local_20 + 0x200;
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20,0,100);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 100,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x6c,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x74,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x7c,0,0xc);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x88,0,0xc);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x94,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x9c,0,1);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x9d,0,1);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x101,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x109,0,1);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x129,0,1);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x149,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x151,0,8);
  pvVar2 = (void *)0x1;
  pcVar3 = "1";
  uVar4 = 0;
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x159,0,1);
  is_null(local_20,0x200);
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   (wchar_t)((ulong)uVar4 >> 0x20),(wchar_t)uVar4,pcVar3,pvVar2);
  local_20 = local_20 + 0x200;
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20,0,100);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 100,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x6c,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x74,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x7c,0,0xc);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x88,0,0xc);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x94,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x9c,0,1);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x9d,0,1);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x101,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x109,0,1);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x129,0,1);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x149,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x151,0,8);
  pvVar2 = (void *)0x1;
  pcVar3 = "1";
  uVar4 = 0;
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x159,0,1);
  is_null(local_20,0x200);
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   (wchar_t)((ulong)uVar4 >> 0x20),(wchar_t)uVar4,pcVar3,pvVar2);
  local_20 = local_20 + 0x200;
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20,0,100);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 100,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x6c,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x74,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x7c,0,0xc);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x88,0,0xc);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x94,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x9c,0,1);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x9d,0,1);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x101,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x109,0,1);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x129,0,1);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x149,0,8);
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x151,0,8);
  pvVar2 = (void *)0x9b;
  pcVar3 = "155";
  v1 = 0;
  assertion_equal_mem(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60)
  ;
  memset(local_20 + 0x159,0,0x9b);
  is_null(local_20,0x200);
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   (wchar_t)((ulong)v1 >> 0x20),(wchar_t)v1,pcVar3,pvVar2);
  local_20 = local_20 + 0x200;
  is_null(local_20,0x400);
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   (wchar_t)((ulong)v1 >> 0x20),(wchar_t)v1,pcVar3,pvVar2);
  local_20 = local_20 + 0x400;
  assertion_equal_int((char *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,v1,pcVar3,0,
                      (char *)0x20f12b,in_stack_fffffffffffffe00);
  free(local_18);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_tar_ustar)
{
	struct archive *a;
	struct archive_entry *entry;
	char *buff, *e;
	size_t buffsize = 100000;
	size_t used;
	int i;
	char f99[100];
	char f100[101];
	char f256[257];

	for (i = 0; i < 99; ++i)
		f99[i] = 'a' + i % 26;
	f99[99] = '\0';

	for (i = 0; i < 100; ++i)
		f100[i] = 'A' + i % 26;
	f100[100] = '\0';

	for (i = 0; i < 256; ++i)
		f256[i] = 'A' + i % 26;
	f256[155] = '/';
	f256[256] = '\0';

	buff = malloc(buffsize);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used));

	/*
	 * Add various files to it.
	 * TODO: Extend this to cover more filetypes.
	 */

	/* "file" with 10 bytes of content */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, "file");
	archive_entry_set_mode(entry, S_IFREG | 0664);
	archive_entry_set_size(entry, 10);
	archive_entry_set_uid(entry, 80);
	archive_entry_set_gid(entry, 90);
	archive_entry_set_dev(entry, 12);
	archive_entry_set_ino(entry, 89);
	archive_entry_set_nlink(entry, 2);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);
	assertEqualIntA(a, 10, archive_write_data(a, "1234567890", 10));

	/* Hardlink to "file" with 10 bytes of content */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, "linkfile");
	archive_entry_set_mode(entry, S_IFREG | 0664);
	/* TODO: Put this back and fix the bug. */
	/* archive_entry_set_size(entry, 10); */
	archive_entry_set_uid(entry, 80);
	archive_entry_set_gid(entry, 90);
	archive_entry_set_dev(entry, 12);
	archive_entry_set_ino(entry, 89);
	archive_entry_set_nlink(entry, 2);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);
	/* Write of data to dir should fail == zero bytes get written. */
	assertEqualIntA(a, 0, archive_write_data(a, "1234567890", 10));

	/* "dir" */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 2, 20);
	archive_entry_set_pathname(entry, "dir");
	archive_entry_set_mode(entry, S_IFDIR | 0775);
	archive_entry_set_size(entry, 10);
	archive_entry_set_nlink(entry, 2);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);
	/* Write of data to dir should fail == zero bytes get written. */
	assertEqualIntA(a, 0, archive_write_data(a, "1234567890", 10));

	/* "symlink" pointing to "file" */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 3, 30);
	archive_entry_set_pathname(entry, "symlink");
	archive_entry_set_mode(entry, 0664);
	archive_entry_set_filetype(entry, AE_IFLNK);
	archive_entry_set_symlink(entry,"file");
	archive_entry_set_size(entry, 0);
	archive_entry_set_uid(entry, 88);
	archive_entry_set_gid(entry, 98);
	archive_entry_set_dev(entry, 12);
	archive_entry_set_ino(entry, 90);
	archive_entry_set_nlink(entry, 1);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);
	/* Write of data to symlink should fail == zero bytes get written. */
	assertEqualIntA(a, 0, archive_write_data(a, "1234567890", 10));

	/* file with 99-char filename. */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, f99);
	archive_entry_set_mode(entry, S_IFREG | 0664);
	archive_entry_set_size(entry, 0);
	archive_entry_set_uid(entry, 82);
	archive_entry_set_gid(entry, 93);
	archive_entry_set_dev(entry, 102);
	archive_entry_set_ino(entry, 7);
	archive_entry_set_nlink(entry, 1);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);

	/* file with 100-char filename. */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, f100);
	archive_entry_set_mode(entry, S_IFREG | 0664);
	archive_entry_set_size(entry, 0);
	archive_entry_set_uid(entry, 82);
	archive_entry_set_gid(entry, 93);
	archive_entry_set_dev(entry, 102);
	archive_entry_set_ino(entry, 7);
	archive_entry_set_nlink(entry, 1);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);

	/* file with 256-char filename. */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, f256);
	archive_entry_set_mode(entry, S_IFREG | 0664);
	archive_entry_set_size(entry, 0);
	archive_entry_set_uid(entry, 82);
	archive_entry_set_gid(entry, 93);
	archive_entry_set_dev(entry, 102);
	archive_entry_set_ino(entry, 7);
	archive_entry_set_nlink(entry, 1);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);

	/* Close out the archive. */
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Verify the archive format.
	 */
	e = buff;

	/* "file" */
	myAssertEqualMem(e + 0, "file", 5); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000120 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000132 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000012 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000001 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "010034\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "0", 1); /* linkflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, "", 1); /* prefix */
	assert(is_null(e + 0, 512));
	myAssertEqualMem(e + 512, "1234567890", 10);
	assert(is_null(e + 512, 512));
	e += 1024;

	/* hardlink to "file" */
	myAssertEqualMem(e + 0, "linkfile", 9); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000120 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000132 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000001 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "010707\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "0", 1); /* linkflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, "", 1); /* prefix */
	assert(is_null(e + 0, 512));
	e += 512;

	/* "dir" */
	myAssertEqualMem(e + 0, "dir/", 4); /* Filename */
	myAssertEqualMem(e + 100, "000775 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000000 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000000 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000002 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "007747\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "5", 1); /* typeflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, "", 1); /* prefix */
	assert(is_null(e + 0, 512));
	e += 512;

	/* "symlink" pointing to "file" */
	myAssertEqualMem(e + 0, "symlink", 8); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000130 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000142 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000003 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "011446\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "2", 1); /* linkflag */
	myAssertEqualMem(e + 157, "file", 5); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, "", 1); /* prefix */
	assert(is_null(e + 0, 512));
	e += 512;

	/* File with 99-char filename */
	myAssertEqualMem(e + 0, f99, 100); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000122 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000135 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000001 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "034242\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "0", 1); /* linkflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, "", 1); /* prefix */
	assert(is_null(e + 0, 512));
	e += 512;

	/* File with 100-char filename */
	myAssertEqualMem(e + 0, f100, 100); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000122 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000135 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000001 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "026230\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "0", 1); /* linkflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, "", 1); /* prefix */
	assert(is_null(e + 0, 512));
	e += 512;

	/* File with 256-char filename */
	myAssertEqualMem(e + 0, f256 + 156, 100); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000122 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000135 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000001 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "055570\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "0", 1); /* linkflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, f256, 155); /* prefix */
	assert(is_null(e + 0, 512));
	e += 512;

	/* TODO: Verify other types of entries. */

	/* Last entry is end-of-archive marker. */
	assert(is_null(e, 1024));
	e += 1024;

	assertEqualInt((int)used, e - buff);

	free(buff);
}